

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::pushGLStates(RenderTarget *this)

{
  bool bVar1;
  uint uVar2;
  RenderTarget *in_RDI;
  Uint64 in_stack_00000008;
  
  bVar1 = anon_unknown.dwarf_1aa64e::RenderTargetImpl::isActive(in_stack_00000008);
  if ((bVar1) || (uVar2 = (*in_RDI->_vptr_RenderTarget[4])(in_RDI,1), (uVar2 & 1) != 0)) {
    (*sf_glad_glPushClientAttrib)(0xffffffff);
    (*sf_glad_glPushAttrib)(0xffffffff);
    (*sf_glad_glMatrixMode)(0x1700);
    (*sf_glad_glPushMatrix)();
    (*sf_glad_glMatrixMode)(0x1701);
    (*sf_glad_glPushMatrix)();
    (*sf_glad_glMatrixMode)(0x1702);
    (*sf_glad_glPushMatrix)();
  }
  resetGLStates(in_RDI);
  return;
}

Assistant:

void RenderTarget::pushGLStates()
{
    if (RenderTargetImpl::isActive(m_id) || setActive(true))
    {
        #ifdef SFML_DEBUG
            // make sure that the user didn't leave an unchecked OpenGL error
            GLenum error = glGetError();
            if (error != GL_NO_ERROR)
            {
                err() << "OpenGL error (" << error << ") detected in user code, "
                      << "you should check for errors with glGetError()"
                      << std::endl;
            }
        #endif

        #ifndef SFML_OPENGL_ES
            glCheck(glPushClientAttrib(GL_CLIENT_ALL_ATTRIB_BITS));
            glCheck(glPushAttrib(GL_ALL_ATTRIB_BITS));
        #endif
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_PROJECTION));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glPushMatrix());
    }

    resetGLStates();
}